

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util_test.cc
# Opt level: O0

void __thiscall
FileTest_Serialize_and_Deserialize_vector_Test::FileTest_Serialize_and_Deserialize_vector_Test
          (FileTest_Serialize_and_Deserialize_vector_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__FileTest_Serialize_and_Deserialize_vector_Test_00196f88;
  return;
}

Assistant:

TEST(FileTest, Serialize_and_Deserialize_vector) {
#ifndef _MSC_VER
   std::string filename = "/tmp/test.bin";
#else
   std::string filename = "../../test.bin";
#endif
   FILE* file = OpenFileOrDie(filename.c_str(), "w");
   // Serialize
   std::vector<int> array;
   for (int i = 0; i < 10; ++i) {
     array.push_back(i);
   }
   WriteVectorToFile(file, array);
   array.clear();
   for (int i = 0; i < 12; ++i) {
     array.push_back(i);
   }
   WriteVectorToFile(file, array);
   array.clear();
   for (int i = 0; i < 15; ++i) {
     array.push_back(i);
   }
   WriteVectorToFile(file, array);
   array.clear();
   Close(file);
   // Deserialize
   file = OpenFileOrDie(filename.c_str(), "r");
   ReadVectorFromFile(file, array);
   for (int i = 0; i < 10; ++i) {
     EXPECT_EQ(array[i], i);
   }
   array.clear();
   ReadVectorFromFile(file, array);
   for (int i = 0; i < 12; ++i) {
     EXPECT_EQ(array[i], i);
   }
   array.clear();
   ReadVectorFromFile(file, array);
   for (int i = 0; i < 15; ++i) {
     EXPECT_EQ(array[i], i);
   }
   Close(file);
   RemoveFile(filename.c_str());
}